

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O3

ObjFunction * compile(char *source)

{
  ObjFunction *pOVar1;
  Compiler local_2230;
  
  initScanner(source);
  local_2230.enclosing = current;
  local_2230.type = TYPE_SCRIPT;
  local_2230.scopeDepth = 0;
  local_2230.function = newFunction();
  local_2230.localCount = 1;
  local_2230.locals[0].depth = 0;
  local_2230.locals[0].isCaptured = false;
  local_2230.locals[0].name.start = "this";
  local_2230.locals[0].name.length = 4;
  parser.hadError = false;
  parser.panicMode = false;
  current = &local_2230;
  advance();
  while (parser.current.type != TOKEN_EOF) {
    declaration();
  }
  advance();
  emitReturn();
  if (parser.hadError == false) {
    pOVar1 = current->function;
  }
  else {
    pOVar1 = (ObjFunction *)0x0;
  }
  current = current->enclosing;
  return pOVar1;
}

Assistant:

ObjFunction *compile(const char *source) {
    initScanner(source);
    Compiler compiler;
    initCompiler(&compiler, TYPE_SCRIPT);
    parser.hadError = false;
    parser.panicMode = false;
    advance();
    while (!match(TOKEN_EOF)) {
        declaration();
    }
    ObjFunction *function = endCompiler();
    return parser.hadError ? NULL : function;
}